

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_init(CFL_CTX *cfl,SequenceHeader *seq_params)

{
  long in_RSI;
  CFL_CTX *in_RDI;
  
  memset(in_RDI,0,0x800);
  memset(in_RDI->ac_buf_q3,0,0x800);
  in_RDI->subsampling_x = *(int *)(in_RSI + 0x60);
  in_RDI->subsampling_y = *(int *)(in_RSI + 100);
  in_RDI->are_parameters_computed = 0;
  in_RDI->store_y = 0;
  clear_cfl_dc_pred_cache_flags(in_RDI);
  return;
}

Assistant:

void cfl_init(CFL_CTX *cfl, const SequenceHeader *seq_params) {
  assert(block_size_wide[CFL_MAX_BLOCK_SIZE] == CFL_BUF_LINE);
  assert(block_size_high[CFL_MAX_BLOCK_SIZE] == CFL_BUF_LINE);

  memset(&cfl->recon_buf_q3, 0, sizeof(cfl->recon_buf_q3));
  memset(&cfl->ac_buf_q3, 0, sizeof(cfl->ac_buf_q3));
  cfl->subsampling_x = seq_params->subsampling_x;
  cfl->subsampling_y = seq_params->subsampling_y;
  cfl->are_parameters_computed = 0;
  cfl->store_y = 0;
  // The DC_PRED cache is disabled by default and is only enabled in
  // cfl_rd_pick_alpha
  clear_cfl_dc_pred_cache_flags(cfl);
}